

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

void __thiscall State::advance(State *this)

{
  point pVar1;
  State *this_local;
  
  pVar1 = nextPos(this);
  this->position = pVar1;
  Grid::setslime(&this->cg,this->position,true);
  this->flags = this->flags & 0xfffffffe;
  return;
}

Assistant:

void State::advance() {
    position = nextPos();
    cg.setslime(position, 1);
    flags &= ~SF_NON_MOVE_MATCH;
}